

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall
ft::list<int,ft::allocator<int>>::mergeSort<ft::less<int>>
          (list<int,ft::allocator<int>> *this,list<int,_ft::allocator<int>_> *first)

{
  size_type sVar1;
  allocator<int> local_41;
  undefined1 local_40 [8];
  list<int,_ft::allocator<int>_> second;
  list<int,_ft::allocator<int>_> *first_local;
  list<int,_ft::allocator<int>_> *this_local;
  
  second._24_8_ = first;
  sVar1 = list<int,_ft::allocator<int>_>::size(first);
  if (1 < sVar1) {
    allocator<int>::allocator(&local_41);
    list<int,_ft::allocator<int>_>::list((list<int,_ft::allocator<int>_> *)local_40,&local_41);
    allocator<int>::~allocator(&local_41);
    list<int,_ft::allocator<int>_>::split
              ((list<int,_ft::allocator<int>_> *)this,
               (list<int,_ft::allocator<int>_> *)second._24_8_,
               (list<int,_ft::allocator<int>_> *)local_40);
    mergeSort<ft::less<int>>(this,second._24_8_);
    mergeSort<ft::less<int>>(this,local_40);
    merge<ft::less<int>>((list<int,ft::allocator<int>> *)second._24_8_,local_40);
    list<int,_ft::allocator<int>_>::~list((list<int,_ft::allocator<int>_> *)local_40);
  }
  return;
}

Assistant:

void mergeSort(list & first, Compare comp) {
		if (first.size() > 1) {
			list	second;
			this->split(first, second);

			this->mergeSort(first, comp);
			this->mergeSort(second, comp);

			first.merge(second, comp);
		}
	}